

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O1

void __thiscall viface::VIfaceImpl::down(VIfaceImpl *this)

{
  pointer pcVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  ostream *poVar5;
  runtime_error *this_00;
  ifreq ifr;
  ostringstream what;
  string local_200;
  string local_1e0 [32];
  ifreq local_1c0;
  ostringstream local_198 [376];
  
  iVar2 = this->kernel_socket;
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + (this->name)._M_string_length);
  read_flags(iVar2,&local_200,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_1c0.ifr_ifru.ifru_slave[0] = local_1c0.ifr_ifru.ifru_slave[0] & 0xfe;
  iVar2 = ioctl(this->kernel_socket,0x8914);
  if (iVar2 == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"--- Unable to bring-down interface ",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".",1);
  std::endl<char,std::char_traits<char>>((ostream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"    Error: ",0xb);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<((ostream *)local_198,pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," (",2);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_198,*piVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,").",2);
  std::endl<char,std::char_traits<char>>(poVar5);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1e0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VIfaceImpl::down() const
{
    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    // Bring-down interface
    ifr.ifr_flags &= ~IFF_UP;
    if (ioctl(this->kernel_socket, SIOCSIFFLAGS, &ifr) != 0) {
        ostringstream what;
        what << "--- Unable to bring-down interface " << this->name;
        what << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return;
}